

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O1

void pbrt::InitPBRT(PBRTOptions *opt)

{
  int nThreads;
  PBRTOptions *this;
  Allocator AVar1;
  
  this = (PBRTOptions *)operator_new(0x108);
  PBRTOptions::PBRTOptions(this,opt);
  Options = this;
  if ((this->super_BasicPBRTOptions).quiet == true) {
    SuppressErrorMessages();
  }
  InitLogging(opt->logLevel,(Options->super_BasicPBRTOptions).useGPU);
  nThreads = Options->nThreads;
  if (nThreads == 0) {
    nThreads = AvailableCores();
  }
  ParallelInit(nThreads);
  if ((Options->super_BasicPBRTOptions).useGPU != true) {
    AVar1.memoryResource = pstd::pmr::new_delete_resource();
    ColorEncodingHandle::Init(AVar1);
    AVar1.memoryResource = pstd::pmr::new_delete_resource();
    Spectra::Init(AVar1);
    AVar1.memoryResource = pstd::pmr::new_delete_resource();
    RGBToSpectrumTable::Init(AVar1);
    AVar1.memoryResource = pstd::pmr::new_delete_resource();
    RGBColorSpace::Init(AVar1);
    AVar1.memoryResource = pstd::pmr::new_delete_resource();
    InitBufferCaches(AVar1);
    AVar1.memoryResource = pstd::pmr::new_delete_resource();
    Triangle::Init(AVar1);
    AVar1.memoryResource = pstd::pmr::new_delete_resource();
    BilinearPatch::Init(AVar1);
    if ((Options->displayServer)._M_string_length != 0) {
      ConnectToDisplayServer(&Options->displayServer);
      return;
    }
    return;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/pbrt.cpp"
           ,0x47,"Options::useGPU set with non-GPU build");
}

Assistant:

void InitPBRT(const PBRTOptions &opt) {
    Options = new PBRTOptions(opt);
    // API Initialization

#ifdef PBRT_IS_WINDOWS
    if (Options->useGPU && Options->gpuDevice &&
        getenv("CUDA_VISIBLE_DEVICES") == nullptr) {
        // Limit CUDA to considering only a single GPU on Windows.  pbrt
        // only uses a single GPU anyway, and if there are multiple GPUs
        // plugged in with different architectures, pbrt's use of unified
        // memory causes a performance hit.  We set this early, before CUDA
        // gets going...
        std::string env = StringPrintf("CUDA_VISIBLE_DEVICES=%d", *Options->gpuDevice);
        _putenv(env.c_str());
        // Now CUDA should only see a single device, so tell it that zero
        // is the one to use.
        *Options->gpuDevice = 0;
    }
#endif  // PBRT_IS_WINDOWS

    if (Options->quiet)
        SuppressErrorMessages();

    InitLogging(opt.logLevel, Options->useGPU);

    // General \pbrt Initialization
    int nThreads = Options->nThreads != 0 ? Options->nThreads : AvailableCores();
    ParallelInit(nThreads);  // Threads must be launched before the
                             // profiler is initialized.

    if (Options->useGPU) {
#ifdef PBRT_BUILD_GPU_RENDERER
        GPUInit();

        CUDA_CHECK(cudaMemcpyToSymbol(OptionsGPU, Options, sizeof(OptionsGPU)));

        ColorEncodingHandle::Init(gpuMemoryAllocator);
        Spectra::Init(gpuMemoryAllocator);
        RGBToSpectrumTable::Init(gpuMemoryAllocator);

        RGBColorSpace::Init(gpuMemoryAllocator);
        InitBufferCaches(gpuMemoryAllocator);
        Triangle::Init(gpuMemoryAllocator);
        BilinearPatch::Init(gpuMemoryAllocator);
#else
        LOG_FATAL("Options::useGPU set with non-GPU build");
#endif
    } else {
        ColorEncodingHandle::Init(Allocator{});
        // Before RGBColorSpace::Init!
        Spectra::Init(Allocator{});
        RGBToSpectrumTable::Init(Allocator{});

        RGBColorSpace::Init(Allocator{});
        InitBufferCaches({});
        Triangle::Init({});
        BilinearPatch::Init({});
    }

    if (!Options->displayServer.empty())
        ConnectToDisplayServer(Options->displayServer);
}